

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitArrayNewSeg(PrintExpressionContents *this,ArrayNewSeg *curr)

{
  bool bVar1;
  HeapType type;
  ostream *this_00;
  ostream *poVar2;
  char *str;
  Name name;
  TypeNamePrinter local_78;
  
  bVar1 = printUnreachableReplacement(this,(Expression *)curr);
  if (!bVar1) {
    printMedium(this->o,"array.new_");
    if (curr->op == NewData) {
      str = "data";
    }
    else {
      if (curr->op != NewElem) {
        handle_unreachable("unexpected op",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                           ,0x8e9);
      }
      str = "elem";
    }
    printMedium(this->o,str);
    std::operator<<(this->o,' ');
    local_78.wasm = this->wasm;
    poVar2 = this->o;
    local_78.currHeapTypeDepth = 0;
    local_78.heapTypeDepths._M_h._M_buckets = &local_78.heapTypeDepths._M_h._M_single_bucket;
    local_78.heapTypeDepths._M_h._M_bucket_count = 1;
    local_78.heapTypeDepths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_78.heapTypeDepths._M_h._M_element_count = 0;
    local_78.heapTypeDepths._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_78.heapTypeDepths._M_h._M_rehash_policy._M_next_resize = 0;
    local_78.heapTypeDepths._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_78.prints = 0;
    local_78.os = poVar2;
    type = wasm::Type::getHeapType
                     (&(curr->super_SpecificExpression<(wasm::Expression::Id)64>).super_Expression.
                       type);
    anon_unknown_217::TypeNamePrinter::print(&local_78,type);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_78.heapTypeDepths._M_h);
    this_00 = std::operator<<(this->o," $");
    name.super_IString.str._M_str = (char *)poVar2;
    name.super_IString.str._M_len = (size_t)(curr->segment).super_IString.str._M_str;
    wasm::operator<<((wasm *)this_00,(ostream *)(curr->segment).super_IString.str._M_len,name);
  }
  return;
}

Assistant:

void visitArrayNewSeg(ArrayNewSeg* curr) {
    if (printUnreachableReplacement(curr)) {
      return;
    }
    printMedium(o, "array.new_");
    switch (curr->op) {
      case NewData:
        printMedium(o, "data");
        break;
      case NewElem:
        printMedium(o, "elem");
        break;
      default:
        WASM_UNREACHABLE("unexpected op");
    }
    o << ' ';
    TypeNamePrinter(o, wasm).print(curr->type.getHeapType());
    o << " $" << curr->segment;
  }